

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O1

void __thiscall DBOPL::Operator::UpdateRates(Operator *this,Chip *chip)

{
  byte bVar1;
  byte bVar2;
  Bit8u BVar3;
  uint uVar4;
  
  bVar1 = this->reg20;
  uVar4 = this->chanData >> (((bVar1 & 0x10) == 0) * '\x02' | 0x18U);
  if (uVar4 != this->ksr) {
    BVar3 = (Bit8u)uVar4;
    this->ksr = BVar3;
    bVar2 = this->reg60;
    if (bVar2 < 0x10) {
      this->attackAdd = 0;
      this->rateZero = this->rateZero | 0x10;
    }
    else {
      this->attackAdd = chip->attackRates[(byte)((bVar2 >> 2 & 0x3c) + BVar3)];
      this->rateZero = this->rateZero & 0xef;
    }
    if ((bVar2 & 0xf) == 0) {
      this->decayAdd = 0;
      this->rateZero = this->rateZero | 8;
    }
    else {
      this->decayAdd = chip->linearRates[(byte)((bVar2 & 0xf) * '\x04' + BVar3)];
      this->rateZero = this->rateZero & 0xf7;
    }
    bVar2 = this->reg80 & 0xf;
    if (bVar2 == 0) {
      bVar2 = this->rateZero;
      this->rateZero = bVar2 | 2;
      this->releaseAdd = 0;
      if ((bVar1 & 0x20) != 0) {
        return;
      }
      bVar2 = bVar2 | 6;
    }
    else {
      this->releaseAdd = chip->linearRates[(byte)(bVar2 * '\x04' + BVar3)];
      bVar2 = this->rateZero;
      this->rateZero = bVar2 & 0xfd;
      if ((bVar1 & 0x20) != 0) {
        return;
      }
      bVar2 = bVar2 & 0xf9;
    }
    this->rateZero = bVar2;
  }
  return;
}

Assistant:

void Operator::UpdateRates( const Chip* chip ) {
	//Mame seems to reverse this where enabling ksr actually lowers
	//the rate, but pdf manuals says otherwise?
	Bit8u newKsr = (Bit8u)((chanData >> SHIFT_KEYCODE) & 0xff);
	if ( !( reg20 & MASK_KSR ) ) {
		newKsr >>= 2;
	}
	if ( ksr == newKsr )
		return;
	ksr = newKsr;
	UpdateAttack( chip );
	UpdateDecay( chip );
	UpdateRelease( chip );
}